

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O1

size_t sylvan_serialize_get(BDD bdd)

{
  avl_node_t *paVar1;
  avl_node *paVar2;
  
  paVar2 = (avl_node *)(bdd & 0x7fffffffffffffff);
  paVar1 = sylvan_ser_set;
  if (paVar2 != (avl_node *)0x0) {
    for (; paVar1 != (avl_node_t *)0x0;
        paVar1 = *(avl_node_t **)(paVar1->pad + (ulong)(paVar1[1].left <= paVar2) * 8 + -0x14)) {
      if (paVar1[1].left == paVar2) {
        paVar1 = paVar1 + 1;
        goto LAB_0010d573;
      }
    }
    paVar1 = (avl_node_t *)0x0;
LAB_0010d573:
    if (paVar1 == (avl_node_t *)0x0) {
      __assert_fail("ss != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                    ,0x8ad,"size_t sylvan_serialize_get(BDD)");
    }
    bdd = bdd & 0x8000000000000000 ^ (ulong)paVar1->right;
  }
  return bdd;
}

Assistant:

size_t
sylvan_serialize_get(BDD bdd)
{
    if (!sylvan_isnode(bdd)) return bdd;
    struct sylvan_ser s, *ss;
    s.bdd = BDD_STRIPMARK(bdd);
    ss = sylvan_ser_search(sylvan_ser_set, &s);
    assert(ss != NULL);
    return BDD_TRANSFERMARK(bdd, ss->assigned);
}